

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O3

bool __thiscall stk::FileWrite::setRawFile(FileWrite *this,string *fileName)

{
  undefined8 in_RAX;
  long lVar1;
  FILE *pFVar2;
  ostream *poVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  lVar1 = std::__cxx11::string::find((char *)fileName,0x1122b3,0);
  if (lVar1 == -1) {
    std::__cxx11::string::append((char *)fileName);
  }
  pFVar2 = fopen((fileName->_M_dataplus)._M_p,"wb");
  this->fd_ = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,"FileWrite: could not create RAW file: ",0x26);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&Stk::oStream__abi_cxx11_,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    uStack_28._0_7_ = CONCAT16(0x2e,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 6),1);
  }
  else {
    if (this->dataType_ != 2) {
      this->dataType_ = 2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&Stk::oStream__abi_cxx11_,
                 "FileWrite: using 16-bit signed integer data format for file ",0x3c);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&Stk::oStream__abi_cxx11_,(fileName->_M_dataplus)._M_p,
                          fileName->_M_string_length);
      uStack_28 = CONCAT17(0x2e,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 7),1);
      Stk::handleError(&this->super_Stk,WARNING);
    }
    this->byteswap_ = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,"FileWrite: creating RAW file: ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,(fileName->_M_dataplus)._M_p,
               fileName->_M_string_length);
    Stk::handleError(&this->super_Stk,STATUS);
  }
  return pFVar2 != (FILE *)0x0;
}

Assistant:

bool FileWrite :: setRawFile( std::string fileName )
{
  if ( fileName.find( ".raw" ) == std::string::npos ) fileName += ".raw";
  fd_ = fopen( fileName.c_str(), "wb" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create RAW file: " << fileName << '.';
    return false;
  }

  if ( dataType_ != STK_SINT16 ) {
    dataType_ = STK_SINT16;
    oStream_ << "FileWrite: using 16-bit signed integer data format for file " << fileName << '.';
    handleError( StkError::WARNING );
  }

  byteswap_ = false;
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
#endif

  oStream_ << "FileWrite: creating RAW file: " << fileName;
  handleError( StkError::STATUS );
  return true;
}